

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3MatchinfoFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  byte bVar1;
  Fts3Table *p;
  Fts3Table *pTab;
  sqlite_int64 iValue;
  bool bVar2;
  Fts3Cursor *pCsr_00;
  int iVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  size_t sVar7;
  size_t sVar8;
  MatchinfoBuffer *pMVar9;
  char *pBuf;
  long lVar10;
  LcsIterator *pCtx;
  ulong uVar11;
  LcsIterator *pLVar12;
  uint uVar13;
  LcsIterator *pIter;
  ulong uVar14;
  LcsIterator *pLVar15;
  int iVar16;
  int nLive;
  u8 *__s;
  sqlite3_stmt *psVar17;
  Fts3Expr *pFVar18;
  LcsIterator *pIter_00;
  byte *__s2;
  long lVar19;
  char *pEnd_00;
  long lVar20;
  char **ppOut;
  long in_FS_OFFSET;
  bool bVar21;
  u8 *local_d0;
  _func_void_void_ptr *local_b0;
  Fts3Cursor *pCsr;
  MatchInfo local_90;
  sqlite3_int64 nToken;
  char *pEnd;
  char *a;
  sqlite3_stmt *pSelect;
  int local_44;
  int nPhrase;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCsr = (Fts3Cursor *)&DAT_aaaaaaaaaaaaaaaa;
  iVar3 = fts3FunctionArg(pContext,"matchinfo",*apVal,&pCsr);
  if (iVar3 == 0) {
    if (nVal < 2) {
      pbVar6 = (byte *)0x0;
    }
    else {
      pbVar6 = sqlite3_value_text(apVal[1]);
    }
    pCsr_00 = pCsr;
    pFVar18 = pCsr->pExpr;
    __s2 = (byte *)"pcx";
    if (pbVar6 != (byte *)0x0) {
      __s2 = pbVar6;
    }
    if (pFVar18 == (Fts3Expr *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sqlite3_result_blob(pContext,"",0,(_func_void_void_ptr *)0x0);
        return;
      }
      goto LAB_001bb650;
    }
    p = (Fts3Table *)(pCsr->base).pVtab;
    local_90.flag = '\0';
    local_90._25_7_ = 0;
    local_90.aMatchinfo = (u32 *)0x0;
    local_90.nDoc = 0;
    local_90.pCursor = pCsr;
    local_90.nPhrase = 0;
    local_90.nCol = p->nColumn;
    pMVar9 = pCsr->pMIBuffer;
    iVar3 = 7;
    if (pMVar9 == (MatchinfoBuffer *)0x0) {
LAB_001bad34:
      _nPhrase = (sqlite3_stmt *)((ulong)_nPhrase & 0xffffffff00000000);
      sqlite3Fts3ExprIterate(pFVar18,fts3ExprPhraseCountCb,&nPhrase);
      pCsr_00->nPhrase = nPhrase;
      local_90.nPhrase = nPhrase;
      lVar19 = 0;
      for (pbVar6 = __s2; bVar1 = *pbVar6, bVar1 != 0; pbVar6 = pbVar6 + 1) {
        _nPhrase = (sqlite3_stmt *)0x0;
        uVar13 = bVar1 - 0x62;
        if (0x17 < uVar13) {
LAB_001bad93:
          if (bVar1 == 0x61) {
LAB_001bad9c:
            if (p->bFts4 != '\0') goto LAB_001badc1;
          }
LAB_001baf1d:
          sqlite3Fts3ErrMsg((char **)&nPhrase,"unrecognized matchinfo request: %c");
          psVar17 = _nPhrase;
          sqlite3_result_error(pContext,(char *)_nPhrase,-1);
          sqlite3_free(psVar17);
          goto LAB_001bb621;
        }
        if ((0xc24003U >> (uVar13 & 0x1f) & 1) == 0) {
          if (uVar13 != 10) {
            if (uVar13 != 0xc) goto LAB_001bad93;
            goto LAB_001bad9c;
          }
          if (p->bHasDocsize == '\0') goto LAB_001baf1d;
        }
LAB_001badc1:
        sVar7 = fts3MatchinfoSize(&local_90,bVar1);
        lVar19 = lVar19 + sVar7;
      }
      sVar8 = strlen((char *)__s2);
      pMVar9 = (MatchinfoBuffer *)sqlite3Fts3MallocZero(sVar8 + lVar19 * 8 + 0x25);
      if (pMVar9 != (MatchinfoBuffer *)0x0) {
        pMVar9->aMatchinfo[0] = 0x1c;
        pMVar9->aMatchinfo[lVar19 + 1] = (int)((lVar19 << 0x20) + 0x100000000U >> 0x1e) + 0x1c;
        pMVar9->nElem = (int)lVar19;
        pMVar9->zMatchinfo = (char *)(pMVar9[1].aRef + lVar19 * 8 + 4);
        memcpy(pMVar9[1].aRef + lVar19 * 8 + 4,__s2,sVar8 + 1);
        pMVar9->aRef[0] = '\x01';
        pCsr_00->pMIBuffer = pMVar9;
        pCsr_00->isMatchinfoNeeded = 1;
        bVar2 = false;
        goto LAB_001baeb0;
      }
      pCsr_00->pMIBuffer = (MatchinfoBuffer *)0x0;
      pCsr_00->isMatchinfoNeeded = 1;
LAB_001baf77:
      local_d0 = (u8 *)0x0;
      local_b0 = (_func_void_void_ptr *)0x0;
LAB_001bb5ee:
      sqlite3_result_error_code(pContext,iVar3);
      if (local_b0 != (_func_void_void_ptr *)0x0) {
        (*local_b0)(local_d0);
      }
    }
    else {
      iVar4 = strcmp(pMVar9->zMatchinfo,(char *)__s2);
      if (iVar4 != 0) {
        sqlite3Fts3MIBufferFree(pMVar9);
        pCsr_00->pMIBuffer = (MatchinfoBuffer *)0x0;
        pFVar18 = pCsr_00->pExpr;
        goto LAB_001bad34;
      }
      bVar2 = true;
LAB_001baeb0:
      local_b0 = fts3MIBufferFree;
      if (pMVar9->aRef[1] == '\0') {
        pMVar9->aRef[1] = '\x01';
        local_d0 = &pMVar9->field_0x1c;
      }
      else if (pMVar9->aRef[2] == '\0') {
        pMVar9->aRef[2] = '\x01';
        local_d0 = pMVar9[1].aRef + (long)pMVar9->nElem * 4;
      }
      else {
        local_d0 = (u8 *)sqlite3_malloc64((long)pMVar9->nElem << 2);
        if (local_d0 == (u8 *)0x0) goto LAB_001baf77;
        local_b0 = sqlite3_free;
        if (pMVar9->bGlobal != 0) {
          memcpy(local_d0,&pMVar9->field_0x1c,(long)pMVar9->nElem << 2);
        }
      }
      local_90.nPhrase = pCsr_00->nPhrase;
      pTab = (Fts3Table *)(pCsr_00->base).pVtab;
      pSelect = (sqlite3_stmt *)0x0;
      iVar3 = 0;
      __s = local_d0;
      for (lVar19 = 0;
          (local_90.aMatchinfo = (u32 *)__s, iVar3 == 0 && (bVar1 = __s2[lVar19], bVar1 != 0));
          lVar19 = lVar19 + 1) {
        local_90.flag = bVar1;
        iVar4 = local_44;
        switch(bVar1) {
        case 0x6c:
          iValue = pCsr_00->iPrevId;
          _nPhrase = (sqlite3_stmt *)0x0;
          iVar3 = fts3SqlStmt(pTab,0x15,(sqlite3_stmt **)&nPhrase,(sqlite3_value **)0x0);
          psVar17 = _nPhrase;
          if (iVar3 == 0) {
            sqlite3_bind_int64(_nPhrase,1,iValue);
            iVar3 = sqlite3_step(psVar17);
            if ((iVar3 == 100) && (iVar3 = sqlite3_column_type(psVar17,0), iVar3 == 4)) {
              local_44 = 0;
              pBuf = (char *)sqlite3_column_blob(psVar17,0);
              iVar3 = sqlite3_column_bytes(psVar17,0);
              pEnd_00 = pBuf + iVar3;
              for (lVar10 = 0; iVar3 = local_44, lVar10 < local_90.nCol; lVar10 = lVar10 + 1) {
                _nPhrase = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
                iVar3 = sqlite3Fts3GetVarintBounded(pBuf,pEnd_00,(sqlite_int64 *)&nPhrase);
                pBuf = pBuf + iVar3;
                if (pEnd_00 < pBuf) {
                  local_44 = 0x10b;
                  iVar3 = local_44;
                  break;
                }
                *(int *)((long)local_90.aMatchinfo + lVar10 * 4) = nPhrase;
              }
            }
            else {
              iVar3 = sqlite3_reset(psVar17);
              if (iVar3 == 0) {
                iVar3 = 0x10b;
              }
              psVar17 = (sqlite3_stmt *)0x0;
            }
          }
          local_44 = iVar3;
          sqlite3_reset(psVar17);
          iVar4 = local_44;
          iVar3 = local_44;
          break;
        case 0x6d:
        case 0x6f:
        case 0x71:
        case 0x72:
switchD_001bb05f_caseD_6d:
          pFVar18 = pCsr_00->pExpr;
          local_44 = fts3ExprLoadDoclists(pCsr_00,(int *)0x0,(int *)0x0);
          iVar4 = local_44;
          iVar3 = local_44;
          if (local_44 == 0) {
            if (bVar2) {
LAB_001bb162:
              sqlite3Fts3ExprIterate(pFVar18,fts3ExprLocalHitsCb,&local_90);
              goto LAB_001bb205;
            }
            iVar4 = 0;
            if ((pCsr_00->pDeferred == (Fts3DeferredToken *)0x0) ||
               (iVar4 = fts3MatchinfoSelectDoctotal
                                  (pTab,&pSelect,&local_90.nDoc,(char **)0x0,(char **)0x0),
               iVar3 = iVar4, iVar4 == 0)) {
              local_44 = iVar4;
              local_44 = sqlite3Fts3ExprIterate(pFVar18,fts3ExprGlobalHitsCb,&local_90);
              sqlite3Fts3EvalTestDeferred(pCsr_00,&local_44);
              iVar4 = local_44;
              iVar3 = local_44;
              if (local_44 == 0) goto LAB_001bb162;
            }
          }
          break;
        case 0x6e:
          if (bVar2) {
LAB_001bb205:
            iVar4 = local_44;
            iVar3 = 0;
          }
          else {
            _nPhrase = (sqlite3_stmt *)0x0;
            iVar4 = fts3MatchinfoSelectDoctotal
                              (pTab,&pSelect,(sqlite3_int64 *)&nPhrase,(char **)0x0,(char **)0x0);
            *local_90.aMatchinfo = nPhrase;
            iVar3 = iVar4;
          }
          break;
        case 0x70:
          iVar3 = 0;
          if (!bVar2) {
            iVar3 = local_90.nPhrase;
LAB_001bb21f:
            *(int *)__s = iVar3;
            iVar3 = 0;
          }
          break;
        case 0x73:
          local_44 = fts3ExprLoadDoclists(pCsr_00,(int *)0x0,(int *)0x0);
          iVar4 = local_44;
          iVar3 = local_44;
          if (local_44 == 0) {
            pCtx = (LcsIterator *)sqlite3Fts3MallocZero((long)pCsr_00->nPhrase << 5);
            iVar4 = 7;
            iVar3 = 7;
            if (pCtx != (LcsIterator *)0x0) {
              sqlite3Fts3ExprIterate(pCsr_00->pExpr,fts3MatchinfoLcsCb,pCtx);
              uVar14 = 0;
              uVar11 = (ulong)(uint)local_90.nPhrase;
              if (local_90.nPhrase < 1) {
                uVar11 = uVar14;
              }
              iVar3 = 0;
              for (; uVar11 * 0x20 != uVar14; uVar14 = uVar14 + 0x20) {
                iVar3 = iVar3 - *(int *)(*(long *)(*(long *)((long)&pCtx->pExpr + uVar14) + 0x20) +
                                        0x50);
                *(int *)((long)&pCtx->iPosOffset + uVar14) = iVar3;
              }
              for (lVar10 = 0; lVar10 < local_90.nCol; lVar10 = lVar10 + 1) {
                lVar20 = 0;
                iVar3 = 0;
                ppOut = &pCtx->pRead;
                while( true ) {
                  if (local_90.nPhrase <= lVar20) break;
                  iVar4 = sqlite3Fts3EvalPhrasePoslist
                                    (pCsr_00,((LcsIterator *)(ppOut + -2))->pExpr,(int)lVar10,ppOut)
                  ;
                  if (iVar4 != 0) goto LAB_001bb533;
                  if (*ppOut != (char *)0x0) {
                    *(int *)(ppOut + 1) = *(int *)(ppOut + -1);
                    fts3LcsIteratorAdvance((LcsIterator *)(ppOut + -2));
                    if (*ppOut == (char *)0x0) {
                      iVar4 = 0x10b;
                      goto LAB_001bb533;
                    }
                    iVar3 = iVar3 + 1;
                  }
                  lVar20 = lVar20 + 1;
                  ppOut = ppOut + 4;
                }
                iVar4 = 0;
                for (; 0 < iVar3; iVar3 = iVar3 - iVar5) {
                  pIter_00 = (LcsIterator *)0x0;
                  pLVar12 = (LcsIterator *)(ulong)(uint)local_90.nPhrase;
                  if (local_90.nPhrase < 1) {
                    pLVar12 = pIter_00;
                  }
                  iVar5 = 0;
                  pLVar15 = pCtx;
                  while (bVar21 = pLVar12 != (LcsIterator *)0x0,
                        pLVar12 = (LcsIterator *)&pLVar12[-1].field_0x1f, bVar21) {
                    if (pLVar15->pRead == (char *)0x0) {
                      iVar5 = 0;
                    }
                    else {
                      if ((pIter_00 == (LcsIterator *)0x0) || (pLVar15->iPos < pIter_00->iPos)) {
                        pIter_00 = pLVar15;
                      }
                      if ((iVar5 == 0) || (iVar16 = 1, pLVar15->iPos == pLVar15[-1].iPos)) {
                        iVar16 = iVar5 + 1;
                      }
                      iVar5 = iVar16;
                      if (iVar4 < iVar16) {
                        iVar4 = iVar16;
                      }
                    }
                    pLVar15 = pLVar15 + 1;
                  }
                  iVar5 = fts3LcsIteratorAdvance(pIter_00);
                }
                *(int *)((long)local_90.aMatchinfo + lVar10 * 4) = iVar4;
              }
              iVar4 = 0;
LAB_001bb533:
              sqlite3_free(pCtx);
              iVar3 = iVar4;
            }
          }
          break;
        default:
          if (bVar1 == 0x61) {
            if (bVar2) goto LAB_001bb205;
            _nPhrase = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
            a = &DAT_aaaaaaaaaaaaaaaa;
            pEnd = &DAT_aaaaaaaaaaaaaaaa;
            local_44 = fts3MatchinfoSelectDoctotal(pTab,&pSelect,(sqlite3_int64 *)&nPhrase,&a,&pEnd)
            ;
            psVar17 = _nPhrase;
            iVar4 = local_44;
            iVar3 = local_44;
            if (local_44 == 0) {
              lVar10 = (long)_nPhrase / 2;
              for (lVar20 = 0; lVar20 < local_90.nCol; lVar20 = lVar20 + 1) {
                nToken = (sqlite3_int64)&DAT_aaaaaaaaaaaaaaaa;
                iVar3 = sqlite3Fts3GetVarintU(a,(sqlite_uint64 *)&nToken);
                a = a + iVar3;
                if (pEnd < a) {
                  local_44 = 0x10b;
                  iVar4 = local_44;
                  iVar3 = 0x10b;
                  goto LAB_001bb565;
                }
                *(int *)((long)local_90.aMatchinfo + lVar20 * 4) =
                     (int)((long)((nToken & 0xffffffffU) + lVar10) / (long)psVar17);
              }
              iVar4 = local_44;
              iVar3 = 0;
            }
          }
          else {
            if (bVar1 != 0x62) {
              if (bVar1 == 99) {
                iVar3 = 0;
                if (!bVar2) {
                  iVar3 = local_90.nCol;
                  goto LAB_001bb21f;
                }
                break;
              }
              if (bVar1 != 0x79) goto switchD_001bb05f_caseD_6d;
            }
            sVar7 = fts3MatchinfoSize(&local_90,bVar1);
            memset(__s,0,sVar7 * 4);
            iVar4 = fts3ExprLHitGather(pCsr_00->pExpr,&local_90);
            iVar3 = iVar4;
          }
        }
LAB_001bb565:
        local_44 = iVar4;
        sVar7 = fts3MatchinfoSize(&local_90,__s2[lVar19]);
        __s = (u8 *)((long)local_90.aMatchinfo + sVar7 * 4);
      }
      sqlite3_reset(pSelect);
      if (!bVar2) {
        pMVar9 = pCsr_00->pMIBuffer;
        pMVar9->bGlobal = 1;
        memcpy(pMVar9[1].aRef + (long)pMVar9->nElem * 4,&pMVar9->field_0x1c,(long)pMVar9->nElem << 2
              );
      }
      if (iVar3 != 0) goto LAB_001bb5ee;
      sqlite3_result_blob(pContext,local_d0,pCsr_00->pMIBuffer->nElem << 2,local_b0);
    }
LAB_001bb621:
    sqlite3Fts3SegmentsClose(p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001bb650:
  __stack_chk_fail();
}

Assistant:

static void fts3MatchinfoFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  assert( nVal==1 || nVal==2 );
  if( SQLITE_OK==fts3FunctionArg(pContext, "matchinfo", apVal[0], &pCsr) ){
    const char *zArg = 0;
    if( nVal>1 ){
      zArg = (const char *)sqlite3_value_text(apVal[1]);
    }
    sqlite3Fts3Matchinfo(pContext, pCsr, zArg);
  }
}